

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O2

void __thiscall
duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
          (CreateTableFunctionInfo *this,TableFunction *function)

{
  allocator local_219;
  string local_218;
  string local_1f8;
  TableFunction local_1d8;
  
  ::std::__cxx11::string::string((string *)&local_1f8,"main",&local_219);
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,TABLE_FUNCTION_ENTRY,&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableFunctionInfo_0178f070;
  ::std::__cxx11::string::string
            ((string *)&local_218,
             (string *)
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              name);
  TableFunctionSet::TableFunctionSet(&this->functions,&local_218);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::string::_M_assign((string *)&(this->super_CreateFunctionInfo).name);
  TableFunction::TableFunction(&local_1d8,function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,&local_1d8
            );
  TableFunction::~TableFunction(&local_1d8);
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreateTableFunctionInfo::CreateTableFunctionInfo(TableFunction function)
    : CreateFunctionInfo(CatalogType::TABLE_FUNCTION_ENTRY), functions(function.name) {
	name = function.name;
	functions.AddFunction(std::move(function));
	internal = true;
}